

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

size_t __thiscall
andres::
BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
::shape(BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
        *this,size_t j)

{
  expression_type_2 *peVar1;
  size_t sVar2;
  runtime_error *this_00;
  expression_type_1 *this_01;
  
  this_01 = this->e1_;
  if (this_01->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    peVar1 = this->e2_;
    if (peVar1->data_ != (pointer)0x0) {
      if ((this_01->geometry_).dimension_ < (peVar1->geometry_).dimension_) {
        this_01 = peVar1;
      }
      sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape(this_01,j);
      return sVar2;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::size_t shape(const std::size_t j) const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shape(j) : e1_.shape(j); }